

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O3

string * cg_default_value_for_type(string *__return_storage_ptr__,string *type)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "false";
    pcVar3 = "";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if ((((((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)) ||
          (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)) ||
         ((iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0 ||
          (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)))) ||
        ((iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0 ||
         ((iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0 ||
          (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)))))) ||
       ((iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0 ||
        ((iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0 ||
         (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 == 0)))))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "0";
      pcVar3 = "";
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "0.0f";
        pcVar3 = "";
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)type);
        if (iVar1 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = "0.0";
          pcVar3 = "";
        }
        else {
          lVar2 = std::__cxx11::string::find((char *)type,0x11cade,0);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (lVar2 == -1) {
            pcVar3 = "";
            pcVar4 = pcVar3;
          }
          else {
            pcVar4 = "nullptr";
            pcVar3 = "";
          }
        }
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cg_default_value_for_type(const std::string &type)
{
    if (type == "bool") return "false";
    else if (type == "boolean") return "false";
    else if (type == "char") return "0";
    else if (type == "unsigned char") return "0";
    else if (type == "short") return "0";
    else if (type == "unsigned short") return "0";
    else if (type == "int") return "0";
    else if (type == "unsigned int") return "0";
    else if (type == "unsigned") return "0";
    else if (type == "long") return "0";
    else if (type == "unsigned long") return "0";
    else if (type == "long long") return "0";
    else if (type == "unsigned long long") return "0";
    else if (type == "float") return "0.0f";
    else if (type == "double") return "0.0";
    else if (type.find("*") != std::string::npos) return "nullptr";
    return "";
}